

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

AssertionResult __thiscall
testing::internal::
CmpHelperEQFailure<putl::state_ptr<(anonymous_namespace)::Foo,unsigned_long,2ul>,putl::state_ptr<(anonymous_namespace)::Foo,unsigned_long,2ul>>
          (internal *this,char *lhs_expression,char *rhs_expression,
          state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *lhs,
          state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *rhs)

{
  state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *value;
  AssertionResult AVar1;
  string local_68;
  string local_48;
  
  FormatForComparisonFailureMessage<putl::state_ptr<(anonymous_namespace)::Foo,unsigned_long,2ul>,putl::state_ptr<(anonymous_namespace)::Foo,unsigned_long,2ul>>
            (&local_68,(internal *)lhs,
             (state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *)rhs_expression,lhs);
  FormatForComparisonFailureMessage<putl::state_ptr<(anonymous_namespace)::Foo,unsigned_long,2ul>,putl::state_ptr<(anonymous_namespace)::Foo,unsigned_long,2ul>>
            (&local_48,(internal *)rhs,value,lhs);
  EqFailure(this,lhs_expression,rhs_expression,&local_68,&local_48,false);
  std::__cxx11::string::~string((string *)&local_48);
  AVar1 = (AssertionResult)std::__cxx11::string::~string((string *)&local_68);
  return AVar1;
}

Assistant:

AssertionResult CmpHelperEQFailure(const char* lhs_expression,
                                   const char* rhs_expression,
                                   const T1& lhs, const T2& rhs) {
  return EqFailure(lhs_expression,
                   rhs_expression,
                   FormatForComparisonFailureMessage(lhs, rhs),
                   FormatForComparisonFailureMessage(rhs, lhs),
                   false);
}